

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_reflection.cc
# Opt level: O2

void __thiscall
google::protobuf::Reflection::ClearOneof
          (Reflection *this,Message *message,OneofDescriptor *oneof_descriptor)

{
  int key;
  string *default_value;
  long *plVar1;
  CppType CVar2;
  uint32 uVar3;
  FieldDescriptor *this_00;
  ulong uVar4;
  undefined8 *puVar5;
  ArenaStringPtr *this_01;
  Arena *arena;
  
  key = *(int *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                (ulong)(uint)((int)(((long)oneof_descriptor -
                                    *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) / 0x30) *
                              4 + (this->schema_).oneof_case_offset_));
  if (key != 0) {
    this_00 = Descriptor::FindFieldByNumber(this->descriptor_,key);
    uVar4 = *(ulong *)((long)&(message->super_MessageLite)._vptr_MessageLite +
                      (ulong)(uint)(this->schema_).metadata_offset_);
    if ((uVar4 & 1) != 0) {
      uVar4 = *(ulong *)((uVar4 & 0xfffffffffffffffe) + 0x18);
    }
    if (uVar4 == 0) {
      CVar2 = FieldDescriptor::cpp_type(this_00);
      if (CVar2 == CPPTYPE_MESSAGE) {
        uVar3 = internal::ReflectionSchema::GetFieldOffset(&this->schema_,this_00);
        plVar1 = *(long **)((long)&(message->super_MessageLite)._vptr_MessageLite + (ulong)uVar3);
        if (plVar1 != (long *)0x0) {
          (**(code **)(*plVar1 + 8))();
        }
      }
      else if (CVar2 == CPPTYPE_STRING) {
        puVar5 = (undefined8 *)internal::ReflectionSchema::GetFieldDefault(&this->schema_,this_00);
        default_value = (string *)*puVar5;
        this_01 = MutableField<google::protobuf::internal::ArenaStringPtr>(this,message,this_00);
        arena = *(Arena **)
                 ((long)&(message->super_MessageLite)._vptr_MessageLite +
                 (ulong)(uint)(this->schema_).metadata_offset_);
        if (((ulong)arena & 1) != 0) {
          arena = *(Arena **)(((ulong)arena & 0xfffffffffffffffe) + 0x18);
        }
        internal::ArenaStringPtr::Destroy(this_01,default_value,arena);
      }
    }
    *(undefined4 *)
     ((long)&(message->super_MessageLite)._vptr_MessageLite +
     (ulong)(uint)((int)(((long)oneof_descriptor -
                         *(long *)(*(long *)(oneof_descriptor + 0x10) + 0x30)) / 0x30) * 4 +
                  (this->schema_).oneof_case_offset_)) = 0;
  }
  return;
}

Assistant:

void Reflection::ClearOneof(Message* message,
                            const OneofDescriptor* oneof_descriptor) const {
  // TODO(jieluo): Consider to cache the unused object instead of deleting
  // it. It will be much faster if an application switches a lot from
  // a few oneof fields.  Time/space tradeoff
  uint32 oneof_case = GetOneofCase(*message, oneof_descriptor);
  if (oneof_case > 0) {
    const FieldDescriptor* field = descriptor_->FindFieldByNumber(oneof_case);
    if (GetArena(message) == nullptr) {
      switch (field->cpp_type()) {
        case FieldDescriptor::CPPTYPE_STRING: {
          switch (field->options().ctype()) {
            default:  // TODO(kenton):  Support other string reps.
            case FieldOptions::STRING: {
              const std::string* default_ptr =
                  &DefaultRaw<ArenaStringPtr>(field).Get();
              MutableField<ArenaStringPtr>(message, field)
                  ->Destroy(default_ptr, GetArena(message));
              break;
            }
          }
          break;
        }

        case FieldDescriptor::CPPTYPE_MESSAGE:
          delete *MutableRaw<Message*>(message, field);
          break;
        default:
          break;
      }
    }

    *MutableOneofCase(message, oneof_descriptor) = 0;
  }
}